

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O3

int yyrefill(GREG *G)

{
  int iVar1;
  char *__ptr;
  
  iVar1 = G->buflen;
  if (iVar1 - G->pos < 0x200) {
    __ptr = G->buf;
    do {
      G->buflen = iVar1 * 2;
      __ptr = (char *)realloc(__ptr,(long)(iVar1 * 2));
      G->buf = __ptr;
      iVar1 = G->buflen;
    } while (iVar1 - G->pos < 0x200);
  }
  iVar1 = getc((FILE *)input);
  if (iVar1 == -1) {
    iVar1 = 0;
  }
  else {
    if ((iVar1 == 0xd) || (iVar1 == 10)) {
      lineNumber = lineNumber + 1;
    }
    G->buf[G->pos] = (char)iVar1;
    G->limit = G->limit + 1;
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

YY_LOCAL(int) yyrefill(GREG *G)
{
  int yyn;
  while (G->buflen - G->pos < 512)
    {
      G->buflen *= 2;
      G->buf= (char*)YY_REALLOC(G->buf, G->buflen, G->data);
    }
  YY_INPUT((G->buf + G->pos), yyn, (G->buflen - G->pos), G->data);
  if (!yyn) return 0;
  G->limit += yyn;
  return 1;
}